

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle1.cpp
# Opt level: O2

void __thiscall OpenMD::ContactAngle1::doFrame(ContactAngle1 *this,int param_1)

{
  SelectionManager *this_00;
  StuntDouble *this_01;
  pointer pdVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> realRoots;
  Polynomial<double> poly;
  int i;
  double local_50;
  Vector3d com;
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate
              ((SelectionSet *)&poly,&(this->super_SequentialAnalyzer).evaluator1_);
    SelectionManager::setSelectionSet
              (&(this->super_SequentialAnalyzer).seleMan1_,(SelectionSet *)&poly);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&poly);
  }
  Vector<double,_3U>::Vector(&com.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  piVar3 = &i;
  this_01 = SelectionManager::beginSelected(this_00,&i);
  uVar2 = extraout_RDX;
  while (this_01 != (StuntDouble *)0x0) {
    dVar6 = this_01->mass_;
    StuntDouble::getPos((Vector3d *)&realRoots,this_01);
    operator*((Vector<double,_3U> *)&poly,(Vector<double,_3U> *)&realRoots,dVar6);
    Vector<double,_3U>::add(&com.super_Vector<double,_3U>,(Vector<double,_3U> *)&poly);
    piVar3 = &i;
    this_01 = SelectionManager::nextSelected(this_00,&i);
    uVar2 = extraout_RDX_00;
  }
  Vector<double,_3U>::div(&com.super_Vector<double,_3U>,(int)piVar3,(int)uVar2);
  dVar6 = com.super_Vector<double,_3U>.data_[2] - this->solidZ_;
  if (dVar6 < 0.0) {
    snprintf(painCave.errMsg,2000,
             "ContactAngle1: Z-center of mass of selection, %lf, was\n\tlocated below the solid reference plane, %lf\n"
            );
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if (dVar6 <= this->dropletRadius_) {
    dVar7 = this->dropletRadius_ * 0.3968502629920499;
    poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
    poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    dVar6 = dVar6 * dVar6 * dVar6;
    dVar7 = dVar7 * dVar7 * dVar7;
    realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(dVar6 + dVar7);
    poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         poly.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Polynomial<double>::setCoefficient(&poly,4,(double *)&realRoots);
    realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(dVar6 * 8.0 + dVar7 * 8.0);
    Polynomial<double>::setCoefficient(&poly,3,(double *)&realRoots);
    realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(dVar6 * 24.0 + dVar7 * 18.0);
    Polynomial<double>::setCoefficient(&poly,2,(double *)&realRoots);
    realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(dVar6 * 32.0);
    Polynomial<double>::setCoefficient(&poly,1,(double *)&realRoots);
    realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(dVar6 * 16.0 + dVar7 * -27.0);
    Polynomial<double>::setCoefficient(&poly,0,(double *)&realRoots);
    Polynomial<double>::FindRealRoots(&realRoots,&poly);
    uVar4 = 0;
    uVar5 = 0xbff00000;
    for (pdVar1 = realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar1 != realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
      dVar6 = 1.0;
      if (*pdVar1 <= 1.0) {
        dVar6 = *pdVar1;
      }
      dVar7 = -1.0;
      if (-1.0 <= dVar6) {
        dVar7 = dVar6;
      }
      if (dVar7 <= (double)CONCAT44(uVar5,uVar4)) {
        dVar7 = (double)CONCAT44(uVar5,uVar4);
      }
      uVar4 = SUB84(dVar7,0);
      uVar5 = (undefined4)((ulong)dVar7 >> 0x20);
    }
    local_50 = acos((double)CONCAT44(uVar5,uVar4));
    local_50 = local_50 * 57.29577951308232;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&(this->super_SequentialAnalyzer).values_,&local_50);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&realRoots.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)&poly);
  }
  else {
    poly.polyPairMap_._M_t._M_impl._0_8_ = 0x4066800000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&(this->super_SequentialAnalyzer).values_,(double *)&poly);
  }
  return;
}

Assistant:

void ContactAngle1::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    RealType mtot = 0.0;
    Vector3d com(V3Zero);
    RealType mass;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      mass = sd->getMass();
      mtot += mass;
      com += sd->getPos() * mass;
    }

    com /= mtot;

    RealType dz = com.z() - solidZ_;

    if (dz < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ContactAngle1: Z-center of mass of selection, %lf, was\n"
               "\tlocated below the solid reference plane, %lf\n",
               com.z(), solidZ_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (dz > dropletRadius_) {
      values_.push_back(180.0);
    } else {
      RealType k = pow(2.0, -4.0 / 3.0) * dropletRadius_;

      RealType z2 = dz * dz;
      RealType z3 = z2 * dz;
      RealType k2 = k * k;
      RealType k3 = k2 * k;

      Polynomial<RealType> poly;
      poly.setCoefficient(4, z3 + k3);
      poly.setCoefficient(3, 8.0 * z3 + 8.0 * k3);
      poly.setCoefficient(2, 24.0 * z3 + 18.0 * k3);
      poly.setCoefficient(1, 32.0 * z3);
      poly.setCoefficient(0, 16.0 * z3 - 27.0 * k3);
      vector<RealType> realRoots = poly.FindRealRoots();

      RealType ct;

      vector<RealType>::iterator ri;

      RealType maxct = -1.0;
      for (ri = realRoots.begin(); ri != realRoots.end(); ++ri) {
        ct = *ri;
        if (ct > 1.0) ct = 1.0;
        if (ct < -1.0) ct = -1.0;

        // use the largest magnitude of ct that it finds:
        if (ct > maxct) { maxct = ct; }
      }

      values_.push_back(acos(maxct) * (180.0 / Constants::PI));
    }
  }